

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r4.h
# Opt level: O2

int sort_5_4::select_sort(int *a,int n)

{
  int iVar1;
  int i;
  long lVar2;
  long lVar3;
  
  lVar2 = 1;
  do {
    iVar1 = a[lVar2];
    for (lVar3 = lVar2; 0 < lVar3; lVar3 = lVar3 + -1) {
      if (a[lVar3 + -1] <= iVar1) goto LAB_0010322f;
      a[lVar3] = a[lVar3 + -1];
    }
    lVar3 = 0;
LAB_0010322f:
    a[(int)lVar3] = iVar1;
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

int insert_sort_1(int *a, int n) {
        int t, j;
        for (int i = 1; i < n; i++) {
            t = a[i];
            for (j = i - 1; j >= 0 && a[j] > t; j--)
                a[1 + j] = a[j];
            a[j + 1] = t;
        }
    }